

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O2

Result __thiscall wabt::anon_unknown_7::Validator::OnThrowExpr(Validator *this,ThrowExpr *expr)

{
  Result RVar1;
  Exception *in_RAX;
  Exception *local_18;
  Exception *except;
  
  this->expr_loc_ = &(expr->super_ExprMixin<(wabt::ExprType)45>).super_Expr.loc;
  local_18 = in_RAX;
  RVar1 = CheckExceptVar(this,&expr->var,&local_18);
  if (RVar1.enum_ == Ok) {
    TypeChecker::OnThrow(&this->typechecker_,&local_18->sig);
  }
  return (Result)Ok;
}

Assistant:

Result Validator::OnThrowExpr(ThrowExpr* expr) {
  expr_loc_ = &expr->loc;
  const Exception* except;
  if (Succeeded(CheckExceptVar(&expr->var, &except))) {
    typechecker_.OnThrow(except->sig);
  }
  return Result::Ok;
}